

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::ExpressionStatement::ExpressionStatement(ExpressionStatement *this,GeneratorState *state)

{
  Expression *pEVar1;
  VariableType local_118;
  ValueRange local_c8;
  undefined1 local_38 [8];
  ExpressionGenerator generator;
  GeneratorState *state_local;
  ExpressionStatement *this_local;
  
  generator.m_expressionStack.
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)state;
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__ExpressionStatement_032d9c78;
  this->m_expression = (Expression *)0x0;
  ExpressionGenerator::ExpressionGenerator
            ((ExpressionGenerator *)local_38,
             (GeneratorState *)
             generator.m_expressionStack.
             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  VariableType::VariableType(&local_118,TYPE_VOID,0);
  ValueRange::ValueRange(&local_c8,&local_118);
  pEVar1 = ExpressionGenerator::generate((ExpressionGenerator *)local_38,&local_c8,0);
  this->m_expression = pEVar1;
  ValueRange::~ValueRange(&local_c8);
  VariableType::~VariableType(&local_118);
  ExpressionGenerator::~ExpressionGenerator((ExpressionGenerator *)local_38);
  return;
}

Assistant:

ExpressionStatement::ExpressionStatement (GeneratorState& state)
	: m_expression(DE_NULL)
{
	ExpressionGenerator generator(state);
	m_expression = generator.generate(ValueRange(VariableType(VariableType::TYPE_VOID)));
}